

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

uint __thiscall
CBlockPolicyEstimator::HighestTargetTracked(CBlockPolicyEstimator *this,FeeEstimateHorizon horizon)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock4;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->m_cs_fee_estimator).super_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  if (LONG_HALFLIFE < horizon) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                  ,0x305,
                  "unsigned int CBlockPolicyEstimator::HighestTargetTracked(FeeEstimateHorizon) const"
                 );
  }
  lVar2 = *(long *)((long)&(this->super_CValidationInterface)._vptr_CValidationInterface +
                   *(long *)(&DAT_00fba2f8 + (ulong)horizon * 8));
  lVar3 = *(long *)(lVar2 + 0x30);
  lVar4 = *(long *)(lVar2 + 0x28);
  iVar1 = *(int *)(lVar2 + 0x78);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)((ulong)(lVar3 - lVar4) >> 3) * iVar1 * -0x55555555;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CBlockPolicyEstimator::HighestTargetTracked(FeeEstimateHorizon horizon) const
{
    LOCK(m_cs_fee_estimator);
    switch (horizon) {
    case FeeEstimateHorizon::SHORT_HALFLIFE: {
        return shortStats->GetMaxConfirms();
    }
    case FeeEstimateHorizon::MED_HALFLIFE: {
        return feeStats->GetMaxConfirms();
    }
    case FeeEstimateHorizon::LONG_HALFLIFE: {
        return longStats->GetMaxConfirms();
    }
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}